

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amha_star.hpp
# Opt level: O2

bool __thiscall
csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::
run(AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double> *this,
   StatePtr *start_state,StatePtr *goal_state)

{
  SearchVertexPtr *pSVar1;
  Heap<double> *this_00;
  vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_> *this_01;
  pointer pHVar2;
  pointer psVar3;
  pointer psVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  pointer psVar6;
  bool bVar7;
  int iVar8;
  __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var9;
  rep rVar10;
  ostream *poVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  shared_ptr<sliding_puzzle::SlidingPuzzleState> *incons_state;
  pointer psVar15;
  element_type *peVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  SearchVertexPtr vertex_copy;
  SearchVertexPtr incons_inad_vertex;
  Heap<double> unit_open_inad;
  undefined1 local_c0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2> local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2> local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2> local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2> local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2> local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::
  make_shared<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,std::shared_ptr<sliding_puzzle::SlidingPuzzleState>&>
            ((shared_ptr<sliding_puzzle::SlidingPuzzleState> *)&unit_open_inad);
  pSVar1 = &(this->
            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
            ).start_vertex_;
  std::
  __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&pSVar1->
               super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
              ,(__shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                *)&unit_open_inad);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &unit_open_inad.data_.
              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::
  __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&(((this->
                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                 ).start_vertex_.
                 super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->self_ptr_).
               super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
              ,&pSVar1->
                super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
             );
  peVar16 = (this->
            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
            ).start_vertex_.
            super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  peVar16->g_cost_ = 0.0;
  peVar16->root_id_ = 1;
  peVar16->depth_ = 0;
  p_Var9 = &std::__detail::
            _Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(this->
                            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                            ).env_ptr_.
                            super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,start_state)->
            super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  ;
  std::
  __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(p_Var9,&pSVar1->
                      super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
             );
  this_00 = &(this->
             super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
             ).open_;
  std::__shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
            (local_40,&pSVar1->
                       super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
            );
  csbpl_common::Heap<double>::insert(this_00,(Ptr *)local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  std::__shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
            (local_50,&pSVar1->
                       super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
            );
  csbpl_common::Heap<double>::decreaseKey(this_00,(Ptr *)local_50,0.0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  this_01 = &this->open_inad_;
  lVar14 = 0;
  lVar13 = 0;
  for (lVar12 = 0;
      lVar12 < (this->
               super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
               ).params_.num_inad_; lVar12 = lVar12 + 1) {
    std::
    make_shared<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,std::shared_ptr<sliding_puzzle::SlidingPuzzleState>>
              ((shared_ptr<sliding_puzzle::SlidingPuzzleState> *)&vertex_copy);
    std::
    vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
    ::push_back(&((pSVar1->
                  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->mha_copy_,&vertex_copy);
    std::
    __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                 *)(*(long *)((long)&(((((pSVar1->
                                         super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr)->mha_copy_).
                                       super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar13) + 0x48),
                &pSVar1->
                 super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
               );
    unit_open_inad.data_.
    super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    unit_open_inad.data_.
    super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    unit_open_inad.data_.
    super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>::push_back
              (this_01,&unit_open_inad);
    pHVar2 = (this_01->
             super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
              (local_60,(__shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                         *)((long)&(((((pSVar1->
                                       super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->mha_copy_).
                                     super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + lVar13));
    csbpl_common::Heap<double>::insert
              ((Heap<double> *)
               ((long)&(pHVar2->data_).
                       super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar14),(Ptr *)local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
    pHVar2 = (this_01->
             super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
              (local_70,(__shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                         *)((long)&(((((pSVar1->
                                       super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->mha_copy_).
                                     super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + lVar13));
    csbpl_common::Heap<double>::decreaseKey
              ((Heap<double> *)
               ((long)&(pHVar2->data_).
                       super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar14),(Ptr *)local_70,0.0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
    csbpl_common::Heap<double>::~Heap(&unit_open_inad);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&vertex_copy.
                super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    lVar13 = lVar13 + 0x10;
    lVar14 = lVar14 + 0x18;
  }
  std::
  make_shared<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,std::shared_ptr<sliding_puzzle::SlidingPuzzleState>&>
            ((shared_ptr<sliding_puzzle::SlidingPuzzleState> *)&unit_open_inad);
  pSVar1 = &(this->
            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
            ).goal_vertex_;
  std::
  __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&pSVar1->
               super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
              ,(__shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                *)&unit_open_inad);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &unit_open_inad.data_.
              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  p_Var9 = &std::__detail::
            _Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(this->
                            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                            ).env_ptr_.
                            super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,goal_state)->
            super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  ;
  std::
  __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(p_Var9,&pSVar1->
                      super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
             );
  lVar13 = 0;
  for (lVar12 = 0;
      lVar12 < (this->
               super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
               ).params_.num_inad_; lVar12 = lVar12 + 1) {
    std::
    make_shared<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,std::shared_ptr<sliding_puzzle::SlidingPuzzleState>&>
              ((shared_ptr<sliding_puzzle::SlidingPuzzleState> *)&unit_open_inad);
    std::
    vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
    ::push_back(&((pSVar1->
                  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->mha_copy_,(value_type *)&unit_open_inad);
    std::
    __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                 *)(*(long *)((long)&(((((pSVar1->
                                         super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr)->mha_copy_).
                                       super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar13) + 0x48),
                &pSVar1->
                 super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
               );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &unit_open_inad.data_.
                super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    lVar13 = lVar13 + 0x10;
  }
  rVar10 = std::chrono::_V2::system_clock::now();
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  params_.start_time_.__d.__r = rVar10;
  iVar8 = (*(this->
            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
            )._vptr_Dijkstra[4])(this);
  if ((char)iVar8 != '\0') {
    sliding_puzzle::SlidingPuzzle::getGoalState((SlidingPuzzle *)&vertex_copy);
    Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::
    backtrackPath((vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                   *)&unit_open_inad,
                  &this->
                   super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                  ,(StatePtr *)&vertex_copy);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&vertex_copy.
                super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::
    vector<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
    ::push_back(&(this->anytime_stats_).solution_paths_,(value_type *)&unit_open_inad);
    vertex_copy.
    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((this->
               super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
               ).params_.eps_ *
              (this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              ).params_.mha_eps_);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&(this->anytime_stats_).solution_eps_,(double *)&vertex_copy);
    lVar12 = std::chrono::_V2::system_clock::now();
    vertex_copy.
    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((double)(lVar12 - (this->
                                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                 ).params_.start_time_.__d.__r) / 1000000000.0);
    std::vector<double,_std::allocator<double>_>::push_back
              (&(this->anytime_stats_).solution_time_,(value_type_conflict1 *)&vertex_copy);
    lVar12 = std::chrono::_V2::system_clock::now();
    incons_inad_vertex.
    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((double)(lVar12 - (this->
                                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                 ).params_.start_time_.__d.__r) / 1000000000.0);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&(this->anytime_stats_).cummulative_time_,(double *)&incons_inad_vertex);
    std::
    vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
    ::~vector((vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
               *)&unit_open_inad);
  }
  lVar12 = std::chrono::_V2::system_clock::now();
  lVar12 = lVar12 - (this->
                    super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                    ).params_.start_time_.__d.__r;
  dVar17 = (this->
           super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
           ).params_.mha_eps_;
  dVar19 = (this->
           super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
           ).params_.eps_ -
           (this->
           super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
           ).params_.delta_eps_;
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  params_.eps_ = dVar19;
  dVar17 = dVar17 - (this->
                    super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                    ).params_.delta_mha_eps_;
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  params_.mha_eps_ = dVar17;
  while( true ) {
    dVar20 = (double)lVar12 / 1000000000.0;
    dVar18 = (this->
             super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
             ).params_.time_limit_;
    if (((dVar19 < 1.0) || (dVar17 < 1.0)) || (dVar18 <= dVar20)) break;
    unit_open_inad.data_.
    super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    unit_open_inad.data_.
    super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    unit_open_inad.data_.
    super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    psVar3 = (this->incons_).
             super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar15 = (this->incons_).
                   super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar15 != psVar3;
        psVar15 = psVar15 + 1) {
      p_Var9 = &std::__detail::
                _Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)(this->
                                super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                ).env_ptr_.
                                super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,psVar15)->
                super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
      ;
      std::
      __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&vertex_copy.
                      super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                     ,p_Var9);
      dVar19 = (vertex_copy.
                super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->g_cost_;
      dVar17 = (this->
               super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
               ).params_.eps_;
      dVar18 = sliding_puzzle::SlidingPuzzle::getAdmissibleHeuristicCost
                         ((this->
                          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                          ).env_ptr_.
                          super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,psVar15);
      (vertex_copy.
       super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)->f_cost_ = dVar17 * dVar18 + dVar19;
      std::
      vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ::push_back((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                   *)&unit_open_inad,
                  (value_type *)
                  &vertex_copy.
                   super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                 );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&vertex_copy.
                  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    while (psVar6 = unit_open_inad.data_.
                    super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
          p_Var9 = (__shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                    *)unit_open_inad.data_.
                      super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
          0 < (int)((ulong)((long)(this->
                                  super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                  ).open_.data_.
                                  super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->
                                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                 ).open_.data_.
                                 super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
      csbpl_common::Heap<double>::remove((Heap<double> *)&incons_inad_vertex,(char *)this_00);
      std::
      static_pointer_cast<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,csbpl_common::Heap<double>::Element>
                ((shared_ptr<csbpl_common::Heap<double>::Element> *)&vertex_copy);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&incons_inad_vertex.
                  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      dVar19 = (vertex_copy.
                super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->g_cost_;
      dVar17 = (this->
               super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
               ).params_.eps_;
      dVar18 = sliding_puzzle::SlidingPuzzle::getAdmissibleHeuristicCost
                         ((this->
                          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                          ).env_ptr_.
                          super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,&(vertex_copy.
                                    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->state_);
      (vertex_copy.
       super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)->f_cost_ = dVar17 * dVar18 + dVar19;
      std::
      vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ::push_back((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                   *)&unit_open_inad,(value_type *)&vertex_copy);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&vertex_copy.
                  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    for (; p_Var9 != (__shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                      *)psVar6; p_Var9 = p_Var9 + 1) {
      std::__shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                (local_80,p_Var9);
      csbpl_common::Heap<double>::insert(this_00,(Ptr *)local_80);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
      std::__shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                (local_90,p_Var9);
      csbpl_common::Heap<double>::decreaseKey(this_00,(Ptr *)local_90,p_Var9->_M_ptr->f_cost_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
    }
    std::
    _Hashtable<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&(this->
             super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
             ).closed_._M_h);
    lVar12 = 0;
    while( true ) {
      if ((this->
          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>)
          .params_.num_inad_ <= lVar12) break;
      vertex_copy.
      super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      vertex_copy.
      super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::
      vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ::reserve((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                 *)&vertex_copy,
                ((long)(this->incons_inad_).
                       super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->incons_inad_).
                       super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) +
                ((long)(this->open_inad_).
                       super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->open_inad_).
                      super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      psVar3 = (this->incons_inad_).
               super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar15 = (this->incons_inad_).
                     super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar15 != psVar3;
          psVar15 = psVar15 + 1) {
        p_Var9 = &std::__detail::
                  _Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)(this->
                                  super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                  ).env_ptr_.
                                  super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,psVar15)->
                  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
        ;
        std::
        __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr(&incons_inad_vertex.
                        super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                       ,p_Var9);
        dVar19 = (incons_inad_vertex.
                  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->g_cost_;
        dVar17 = (this->
                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                 ).params_.eps_;
        dVar18 = sliding_puzzle::SlidingPuzzle::getInadmissibleHeuristicCost
                           ((this->
                            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                            ).env_ptr_.
                            super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,psVar15,(int)lVar12);
        psVar4 = ((incons_inad_vertex.
                   super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->mha_copy_).
                 super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        (psVar4[lVar12].
         super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->f_cost_ = dVar17 * dVar18 + dVar19;
        std::
        vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
        ::push_back((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                     *)&vertex_copy,psVar4 + lVar12);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&incons_inad_vertex.
                    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
      while( true ) {
        _Var5._M_pi = vertex_copy.
                      super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        pHVar2 = (this_01->
                 super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        peVar16 = vertex_copy.
                  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        if ((int)((ulong)((long)pHVar2[lVar12].data_.
                                super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         *(long *)&pHVar2[lVar12].data_.
                                   super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                   ._M_impl) >> 4) < 1) break;
        csbpl_common::Heap<double>::remove((Heap<double> *)local_c0,(char *)(pHVar2 + lVar12));
        std::
        static_pointer_cast<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,csbpl_common::Heap<double>::Element>
                  ((shared_ptr<csbpl_common::Heap<double>::Element> *)&incons_inad_vertex);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
        dVar19 = (((incons_inad_vertex.
                    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->self_ptr_).
                  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->g_cost_;
        dVar17 = (this->
                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                 ).params_.eps_;
        dVar18 = sliding_puzzle::SlidingPuzzle::getInadmissibleHeuristicCost
                           ((this->
                            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                            ).env_ptr_.
                            super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,&(incons_inad_vertex.
                                      super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->state_,(int)lVar12);
        (incons_inad_vertex.
         super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->f_cost_ = dVar17 * dVar18 + dVar19;
        std::
        vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
        ::push_back((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                     *)&vertex_copy,(value_type *)&incons_inad_vertex);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&incons_inad_vertex.
                    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
      for (; peVar16 != (element_type *)_Var5._M_pi; peVar16 = (element_type *)&peVar16->state_) {
        pHVar2 = (this_01->
                 super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                  (local_a0,(__shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                             *)peVar16);
        csbpl_common::Heap<double>::insert(pHVar2 + lVar12,(Ptr *)local_a0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
        pHVar2 = (this_01->
                 super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                  ((__shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2> *)
                   (local_c0 + 0x10),
                   (__shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                    *)peVar16);
        csbpl_common::Heap<double>::decreaseKey
                  (pHVar2 + lVar12,(Ptr *)(local_c0 + 0x10),
                   ((element_type *)(peVar16->super_Element).key_)->f_cost_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
      }
      std::
      vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ::~vector((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                 *)&vertex_copy);
      lVar12 = lVar12 + 1;
    }
    std::
    _Hashtable<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&(this->closed_inad_)._M_h);
    iVar8 = (*(this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              )._vptr_Dijkstra[4])(this);
    if ((char)iVar8 != '\0') {
      sliding_puzzle::SlidingPuzzle::getGoalState((SlidingPuzzle *)&incons_inad_vertex);
      Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::
      backtrackPath((vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                     *)&vertex_copy,
                    &this->
                     super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                    ,(StatePtr *)&incons_inad_vertex);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&incons_inad_vertex.
                  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::
      vector<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
      ::push_back(&(this->anytime_stats_).solution_paths_,
                  (vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                   *)&vertex_copy);
      incons_inad_vertex.
      super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)
                ((this->
                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                 ).params_.eps_ *
                (this->
                super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                ).params_.mha_eps_);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&(this->anytime_stats_).solution_eps_,(double *)&incons_inad_vertex);
      dVar19 = 0.0;
      if ((this->anytime_stats_).solution_time_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (this->anytime_stats_).solution_time_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        dVar19 = dVar20;
      }
      lVar12 = std::chrono::_V2::system_clock::now();
      incons_inad_vertex.
      super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)
                ((double)(lVar12 - (this->
                                   super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                   ).params_.start_time_.__d.__r) / 1000000000.0 - dVar19);
      std::vector<double,_std::allocator<double>_>::push_back
                (&(this->anytime_stats_).solution_time_,(value_type_conflict1 *)&incons_inad_vertex)
      ;
      lVar12 = std::chrono::_V2::system_clock::now();
      local_c0._0_8_ =
           (double)(lVar12 - (this->
                             super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                             ).params_.start_time_.__d.__r) / 1000000000.0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&(this->anytime_stats_).cummulative_time_,(double *)local_c0);
      std::
      vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
      ::~vector((vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                 *)&vertex_copy);
    }
    dVar19 = (this->
             super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
             ).params_.mha_eps_;
    (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
    ).params_.eps_ =
         (this->
         super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
         params_.eps_ -
         (this->
         super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
         params_.delta_eps_;
    (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
    ).params_.mha_eps_ =
         dVar19 - (this->
                  super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                  ).params_.delta_mha_eps_;
    lVar12 = std::chrono::_V2::system_clock::now();
    lVar12 = lVar12 - (this->
                      super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                      ).params_.start_time_.__d.__r;
    std::
    vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
    ::~vector((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
               *)&unit_open_inad);
    dVar19 = (this->
             super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
             ).params_.eps_;
    dVar17 = (this->
             super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
             ).params_.mha_eps_;
  }
  bVar7 = true;
  if ((dVar18 < dVar20) &&
     ((this->anytime_stats_).solution_paths_.
      super__Vector_base<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->anytime_stats_).solution_paths_.
      super__Vector_base<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "[AMHAStar::run] Time limit exceeded and no solution found... Exiting!"
                             );
    std::endl<char,std::char_traits<char>>(poVar11);
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

virtual bool run(StatePtr& start_state,
                     StatePtr& goal_state)
    {
      
      this->start_vertex_ = std::make_shared<SearchVertex>(start_state);
      this->start_vertex_->self_ptr_ = this->start_vertex_;
      this->start_vertex_->g_cost_ = 0;
      this->start_vertex_->root_id_ = 1;
      this->start_vertex_->depth_ = 0;
      this->env_ptr_->explored_[start_state] = this->start_vertex_;
      
      this->open_.insert(this->start_vertex_);
      this->open_.decreaseKey(this->start_vertex_, 0.0);
      
      for (int i=0; i<this->params_.num_inad_; ++i)
      {
        // Duplicating vertex
        // @FIXME Why am I using std::move() here?
        SearchVertexPtr vertex_copy = std::make_shared<SearchVertex>(std::move(start_state));
        this->start_vertex_->mha_copy_.push_back(vertex_copy);
        this->start_vertex_->mha_copy_[i]->self_ptr_ = this->start_vertex_;
        
        csbpl_common::Heap<HeapValueType> unit_open_inad;
        open_inad_.push_back(unit_open_inad);
        
        open_inad_[i].insert(this->start_vertex_->mha_copy_[i]);
        open_inad_[i].decreaseKey(this->start_vertex_->mha_copy_[i], 0.0);
      }
      
      this->goal_vertex_ = std::make_shared<SearchVertex>(goal_state);
      this->env_ptr_->explored_[goal_state] = this->goal_vertex_;
      for (int i=0; i<this->params_.num_inad_; ++i)
      {
        SearchVertexPtr vertex_copy = std::make_shared<SearchVertex>(goal_state);
        this->goal_vertex_->mha_copy_.push_back(vertex_copy);
        this->goal_vertex_->mha_copy_[i]->self_ptr_ = this->goal_vertex_;
      }
      
      // Start timer
      this->params_.start_time_ = Clock::now();
      
//      Suboptimality bound on current solution
//      @TODO Report the tigher suboptimality as done in the ARA Star paper.
//      for (const auto& incons_node: incons_)
//      {
//        double f_incons = this->env_ptr_->explored_[incons_node]->g_cost_ +
//          this->params_.eps_*this->env_ptr_->getAdmissibleHeuristicCost(incons_node);
//      }
      
      if (improvePath())
      {
        std::vector<StatePtr> path =
          this->backtrackPath(this->env_ptr_->getGoalState());
        anytime_stats_.solution_paths_.push_back(path);
        anytime_stats_.solution_eps_.push_back(this->params_.eps_*this->params_.mha_eps_);
        double unit_solution_time =
          duration_cast<duration<double> >(Clock::now() -
                                           this->params_.start_time_).count();
        anytime_stats_.solution_time_.push_back(unit_solution_time);
        anytime_stats_.cummulative_time_.push_back(duration_cast<duration<double> >(Clock::now() -
                                                                                    this->params_.start_time_).count());
      }
      
      double time_elapsed =
        duration_cast<duration<double> >(Clock::now() -
                                         this->params_.start_time_).count();
      
      // Updating w1 and w2
      this->params_.eps_ -= this->params_.delta_eps_;
      this->params_.mha_eps_ -= this->params_.delta_mha_eps_;
      
      // Outer loop
      while (this->params_.eps_ >= 1 &&
             this->params_.mha_eps_ >= 1 &&
             time_elapsed < this->params_.time_limit_)
      {
        // OPEN U INCONS and clearing CLOSED
        std::vector<SearchVertexPtr> open_u_incons;
        for (const auto& incons_state: incons_)
        {
          SearchVertexPtr incons_vertex = this->env_ptr_->explored_[incons_state];
          incons_vertex->f_cost_ = incons_vertex->g_cost_ +
                                   this->params_.eps_*this->env_ptr_->getAdmissibleHeuristicCost(incons_state);
          open_u_incons.push_back(incons_vertex);
        }
        while (this->open_.size() > 0)
        {
          SearchVertexPtr open_vertex =
            std::static_pointer_cast<SearchVertex>(this->open_.remove());
          open_vertex->f_cost_ = open_vertex->g_cost_ +
                                 this->params_.eps_*this->env_ptr_->getAdmissibleHeuristicCost(open_vertex->state_);
          open_u_incons.push_back(open_vertex);
        }
        
        for (const SearchVertexPtr& new_open : open_u_incons)
        {
          this->open_.insert(new_open);
          this->open_.decreaseKey(new_open,
                                  new_open->f_cost_);
        }
        
        this->closed_.clear();
        
        
        // OPEN_INAD U INCONS_INAD and clearing CLOSED_INAD
        for (int i=0; i<this->params_.num_inad_; ++i)
        {
          std::vector<SearchVertexPtr> open_inad_u_incons_inad;
          open_inad_u_incons_inad.reserve(open_inad_.size()+incons_inad_.size());
          for (const auto& incons_inad_state: incons_inad_)
          {
            SearchVertexPtr incons_inad_vertex = this->env_ptr_->explored_[incons_inad_state];
            incons_inad_vertex->mha_copy_[i]->f_cost_ = incons_inad_vertex->g_cost_ +
                                                        this->params_.eps_ *
                                                        this->env_ptr_->getInadmissibleHeuristicCost(incons_inad_state, i);
            open_inad_u_incons_inad.push_back(incons_inad_vertex->mha_copy_[i]);
          }
          while (open_inad_[i].size() > 0)
          {
            SearchVertexPtr open_inad_vertex =
              std::static_pointer_cast<SearchVertex>(open_inad_[i].remove());
            open_inad_vertex->f_cost_ = open_inad_vertex->self_ptr_->g_cost_ +
                                        this->params_.eps_ *
                                        this->env_ptr_->getInadmissibleHeuristicCost(open_inad_vertex->state_, i);
            open_inad_u_incons_inad.push_back(open_inad_vertex);
          }
          
          for (const SearchVertexPtr& new_open : open_inad_u_incons_inad)
          {
            open_inad_[i].insert(new_open);
            open_inad_[i].decreaseKey(new_open,
                                      new_open->f_cost_);
          }
        }
        
        closed_inad_.clear();
        
        if (improvePath())
        {
          std::vector<StatePtr> path =
            this->backtrackPath(this->env_ptr_->getGoalState());
          anytime_stats_.solution_paths_.push_back(path);
          anytime_stats_.solution_eps_.push_back(this->params_.eps_*this->params_.mha_eps_);
          double unit_solution_time = anytime_stats_.solution_time_.size()==0?
                                      duration_cast<duration<double> >(Clock::now() -
                                                                       this->params_.start_time_).count():
                                      duration_cast<duration<double> >(Clock::now() -
                                                                       this->params_.start_time_).count() -
                                      time_elapsed;
          anytime_stats_.solution_time_.push_back(unit_solution_time);
          anytime_stats_.cummulative_time_.push_back(duration_cast<duration<double> >(Clock::now() -
                                                                                      this->params_.start_time_).count());
        }
        
        // Epsilon update
        this->params_.eps_ -= this->params_.delta_eps_;
        this->params_.mha_eps_ -= this->params_.delta_mha_eps_;
        
        // Time elapsed update
        time_elapsed =
          duration_cast<duration<double> >(Clock::now() -
                                           this->params_.start_time_).count();
        
      }
      
      if (time_elapsed > this->params_.time_limit_ &&
          anytime_stats_.solution_paths_.size()==0)
      {
        std::cout << "[AMHAStar::run] Time limit exceeded and"
                     " no solution found... Exiting!" << std::endl;
        return false;
      }
      
      return true;
      
    }